

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metamakefile.cpp
# Opt level: O2

void __thiscall SubdirsMetaMakefileGenerator::Subdir::~Subdir(Subdir *this)

{
  if (this->makefile != (MetaMakefileGenerator *)0x0) {
    (*this->makefile->_vptr_MetaMakefileGenerator[1])();
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->output_file).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->output_dir).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this);
  return;
}

Assistant:

~Subdir() { delete makefile; }